

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::ReplaceChild
          (TiXmlNode *this,TiXmlNode *replaceThis,TiXmlNode *withThis)

{
  TiXmlNode *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  TiXmlNode *pTVar4;
  TiXmlNode **ppTVar5;
  TiXmlNode *pTVar3;
  
  if (replaceThis->parent == this) {
    iVar2 = (*(withThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(withThis);
    pTVar3 = (TiXmlNode *)CONCAT44(extraout_var,iVar2);
    if (pTVar3 != (TiXmlNode *)0x0) {
      pTVar1 = replaceThis->next;
      pTVar3->next = pTVar1;
      pTVar4 = replaceThis->prev;
      pTVar3->prev = pTVar4;
      if (pTVar1 == (TiXmlNode *)0x0) {
        this->lastChild = pTVar3;
      }
      else {
        pTVar1->prev = pTVar3;
        pTVar4 = replaceThis->prev;
      }
      ppTVar5 = &pTVar4->next;
      if (pTVar4 == (TiXmlNode *)0x0) {
        ppTVar5 = &this->firstChild;
      }
      *ppTVar5 = pTVar3;
      (*(replaceThis->super_TiXmlBase)._vptr_TiXmlBase[1])(replaceThis);
      pTVar3->parent = this;
      return pTVar3;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::ReplaceChild(TiXmlNode* replaceThis,
	const TiXmlNode& withThis) {
	if (replaceThis->parent != this)
		return 0;

	TiXmlNode* node = withThis.Clone();
	if (!node)
		return 0;

	node->next = replaceThis->next;
	node->prev = replaceThis->prev;

	if (replaceThis->next)
		replaceThis->next->prev = node;
	else
		lastChild = node;

	if (replaceThis->prev)
		replaceThis->prev->next = node;
	else
		firstChild = node;

	delete replaceThis;
	node->parent = this;
	return node;
}